

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

iterator *
cs_impl::array_cs_ext::insert(iterator *__return_storage_ptr__,array *arr,iterator *pos,var *val)

{
  any aStack_48;
  any local_40;
  const_iterator local_38;
  
  local_38._M_cur = pos->_M_cur;
  local_38._M_first = pos->_M_first;
  local_38._M_last = pos->_M_last;
  local_38._M_node = pos->_M_node;
  local_40.mDat = val->mDat;
  if (local_40.mDat != (proxy *)0x0) {
    (local_40.mDat)->refcount = (local_40.mDat)->refcount + 1;
  }
  cs::copy((EVP_PKEY_CTX *)&aStack_48,(EVP_PKEY_CTX *)&local_40);
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::insert
            (__return_storage_ptr__,arr,&local_38,&aStack_48);
  any::recycle(&aStack_48);
  any::recycle(&local_40);
  return __return_storage_ptr__;
}

Assistant:

array::iterator insert(array &arr, array::iterator &pos, const var &val)
		{
			return arr.insert(pos, copy(val));
		}